

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,ComputeInvocationsTestInstance *this,
          VkCommandPool *cmdPool,VkPipelineLayout pipelineLayout,VkDescriptorSet *descriptorSet,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  RefData<vk::Handle<(vk::HandleType)11>_> data_03;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  VkResult VVar6;
  deUint32 dVar7;
  DeviceInterface *vk_00;
  VkDevice device_00;
  Buffer *pBVar8;
  size_type sVar9;
  ProgramCollection<vk::ProgramBinary> *this_00;
  const_reference pvVar10;
  ProgramBinary *binary;
  Handle<(vk::HandleType)14> *pHVar11;
  VkCommandBuffer_s **ppVVar12;
  Handle<(vk::HandleType)11> *pHVar13;
  Handle<(vk::HandleType)18> *pHVar14;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar15;
  VkDeviceSize VVar16;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  uint local_4f4;
  void *pvStack_4f0;
  deUint32 ndx;
  deUint32 *bufferPtr;
  string local_4e0;
  deUint64 local_4c0;
  ulong local_4b8;
  deUint64 data;
  Allocation local_4a8;
  Allocation *local_488;
  Allocation *bufferAllocation;
  MessageBuilder local_478;
  deUint64 local_2f8;
  deUint64 local_2f0;
  deUint64 local_2e8;
  deUint64 local_2e0;
  deUint64 local_2d8;
  Move<vk::Handle<(vk::HandleType)11>_> local_2d0;
  RefData<vk::Handle<(vk::HandleType)11>_> local_2b0;
  undefined1 local_290 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> queryPool;
  Move<vk::VkCommandBuffer_s_*> local_268;
  RefData<vk::VkCommandBuffer_s_*> local_248;
  undefined1 local_228 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)18>_> local_200;
  RefData<vk::Handle<(vk::HandleType)18>_> local_1e0;
  undefined1 local_1c0 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkComputePipelineCreateInfo pipelineCreateInfo;
  VkPipelineShaderStageCreateInfo pipelineShaderStageParams;
  RefData<vk::Handle<(vk::HandleType)14>_> local_f0;
  undefined1 local_d0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  SharedPtr<vkt::Draw::Buffer> local_a0;
  ulong local_90;
  size_t parametersNdx;
  VkBufferMemoryBarrier computeFinishBarrier;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SharedPtr<vkt::Draw::Buffer> *buffer_local;
  VkDescriptorSet *descriptorSet_local;
  VkCommandPool *cmdPool_local;
  ComputeInvocationsTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  vk_00 = Context::getDeviceInterface
                    ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.
                                 m_context);
  computeFinishBarrier.size =
       (VkDeviceSize)
       Context::getUniversalQueue
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  parametersNdx._0_4_ = 0x2c;
  computeFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  computeFinishBarrier._4_4_ = 0;
  computeFinishBarrier.pNext._0_4_ = 0x40;
  computeFinishBarrier.pNext._4_4_ = 0x2000;
  computeFinishBarrier.srcAccessMask = 0xffffffff;
  computeFinishBarrier.dstAccessMask = 0xffffffff;
  pBVar8 = de::SharedPtr<vkt::Draw::Buffer>::operator->(buffer);
  computeFinishBarrier._24_8_ = Draw::Buffer::object(pBVar8);
  computeFinishBarrier.buffer.m_internal = 0;
  computeFinishBarrier.offset = bufferSizeBytes;
  local_90 = 0;
  do {
    uVar2 = local_90;
    sVar9 = std::
            vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            ::size(this->m_parameters);
    if (sVar9 <= uVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"Pass",&local_541);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      return __return_storage_ptr__;
    }
    de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&local_a0,buffer);
    clearBuffer(vk_00,device_00,&local_a0,bufferSizeBytes);
    de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_a0);
    this_00 = Context::getBinaryCollection
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
    pvVar10 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::operator[](this->m_parameters,local_90);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&pvVar10->shaderName);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)
               &pipelineShaderStageParams.pSpecializationInfo,vk_00,device_00,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_f0,(Move *)&pipelineShaderStageParams.pSpecializationInfo);
    data_00.deleter.m_deviceIface._0_4_ = (int)local_f0.deleter.m_deviceIface;
    data_00.object.m_internal = local_f0.object.m_internal;
    data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f0.deleter.m_deviceIface >> 0x20);
    data_00.deleter.m_device._0_4_ = (int)local_f0.deleter.m_device;
    data_00.deleter.m_device._4_4_ = (int)((ulong)local_f0.deleter.m_device >> 0x20);
    data_00.deleter.m_allocator._0_4_ = (int)local_f0.deleter.m_allocator;
    data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_f0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_d0,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)14>_> *)
               &pipelineShaderStageParams.pSpecializationInfo);
    pipelineCreateInfo.basePipelineIndex = 0x12;
    pipelineShaderStageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineShaderStageParams._4_4_ = 0;
    pipelineShaderStageParams.pNext._0_4_ = 0;
    pipelineShaderStageParams.pNext._4_4_ = 0x20;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_d0);
    pipelineCreateInfo.stage._16_8_ = pHVar11->m_internal;
    pipelineShaderStageParams.module.m_internal = (long)"pre_main" + 4;
    pipelineShaderStageParams.pName = (char *)0x0;
    pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._0_4_ = 0x1d;
    pipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineCreateInfo._4_4_ = 0;
    pipelineCreateInfo.pNext._0_4_ = 0;
    pipelineCreateInfo._20_4_ = pipelineCreateInfo._92_4_;
    pipelineCreateInfo.flags = pipelineCreateInfo.basePipelineIndex;
    pipelineCreateInfo.stage.pNext =
         (void *)CONCAT44(pipelineShaderStageParams.pNext._4_4_,
                          pipelineShaderStageParams.pNext._0_4_);
    pipelineCreateInfo.stage.module.m_internal = (long)"pre_main" + 4;
    pipelineCreateInfo.stage.pName = (char *)0x0;
    pipelineCreateInfo.stage.sType = pipelineShaderStageParams.sType;
    pipelineCreateInfo.stage._4_4_ = pipelineShaderStageParams._4_4_;
    pipelineCreateInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pipelineLayout.m_internal
    ;
    pipelineShaderStageParams._16_8_ = pipelineCreateInfo.stage._16_8_;
    ::vk::Handle<(vk::HandleType)18>::Handle
              ((Handle<(vk::HandleType)18> *)&pipelineCreateInfo.layout,0);
    pipelineCreateInfo.basePipelineHandle.m_internal._0_4_ = 0;
    ::vk::Handle<(vk::HandleType)15>::Handle
              ((Handle<(vk::HandleType)15> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,0);
    ::vk::createComputePipeline
              (&local_200,vk_00,device_00,
               (VkPipelineCache)
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,
               (VkComputePipelineCreateInfo *)
               &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
               (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e0,(Move *)&local_200);
    data_01.deleter.m_deviceIface._0_4_ = (int)local_1e0.deleter.m_deviceIface;
    data_01.object.m_internal = local_1e0.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1e0.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_device._0_4_ = (int)local_1e0.deleter.m_device;
    data_01.deleter.m_device._4_4_ = (int)((ulong)local_1e0.deleter.m_device >> 0x20);
    data_01.deleter.m_allocator._0_4_ = (int)local_1e0.deleter.m_allocator;
    data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1e0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_1c0,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_200);
    queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)cmdPool->m_internal;
    ::vk::allocateCommandBuffer
              (&local_268,vk_00,device_00,
               (VkCommandPool)
               queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_248,(Move *)&local_268);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_248.deleter.m_deviceIface;
    data_02.object = local_248.object;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_248.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device._0_4_ = (int)local_248.deleter.m_device;
    data_02.deleter.m_device._4_4_ = (int)((ulong)local_248.deleter.m_device >> 0x20);
    data_02.deleter.m_pool.m_internal._0_4_ = (int)local_248.deleter.m_pool.m_internal;
    data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_248.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_228,data_02);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_268);
    makeQueryPool(&local_2d0,vk_00,device_00,0x400);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2b0,(Move *)&local_2d0);
    data_03.deleter.m_deviceIface._0_4_ = (int)local_2b0.deleter.m_deviceIface;
    data_03.object.m_internal = local_2b0.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2b0.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_device._0_4_ = (int)local_2b0.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_2b0.deleter.m_device >> 0x20);
    data_03.deleter.m_allocator._0_4_ = (int)local_2b0.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_2b0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_290,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_2d0);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    beginCommandBuffer(vk_00,*ppVVar12);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    pVVar1 = *ppVVar12;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_290);
    local_2d8 = pHVar13->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x70])(vk_00,pVVar1,local_2d8,0,1);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    pVVar1 = *ppVVar12;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_1c0);
    local_2e0 = pHVar14->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,1,local_2e0);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    local_2e8 = pipelineLayout.m_internal;
    (*vk_00->_vptr_DeviceInterface[0x56])
              (vk_00,*ppVVar12,1,pipelineLayout.m_internal,0,1,descriptorSet,0,0);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    pVVar1 = *ppVVar12;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_290);
    local_2f0 = pHVar13->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x6e])(vk_00,pVVar1,local_2f0,0);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    pVVar1 = *ppVVar12;
    pvVar10 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::operator[](this->m_parameters,local_90);
    uVar3 = tcu::Vector<unsigned_int,_3>::x(&pvVar10->groupSize);
    pvVar10 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::operator[](this->m_parameters,local_90);
    uVar4 = tcu::Vector<unsigned_int,_3>::y(&pvVar10->groupSize);
    pvVar10 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::operator[](this->m_parameters,local_90);
    uVar5 = tcu::Vector<unsigned_int,_3>::z(&pvVar10->groupSize);
    (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar1,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    pVVar1 = *ppVVar12;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_290);
    local_2f8 = pHVar13->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x6f])(vk_00,pVVar1,local_2f8,0);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    (*vk_00->_vptr_DeviceInterface[0x6d])
              (vk_00,*ppVVar12,0x800,0x4000,0,0,0,1,(int)&parametersNdx,0,0);
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    VVar6 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar12);
    ::vk::checkResult(VVar6,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                      ,0x17f);
    this_01 = Context::getTestContext
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
    this_02 = tcu::TestContext::getLog(this_01);
    tcu::TestLog::operator<<(&local_478,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_478,(char (*) [29])"Compute shader invocations: ");
    pvVar10 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::operator[](this->m_parameters,local_90);
    bufferAllocation._4_4_ = getComputeExecution(this,pvVar10);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(uint *)((long)&bufferAllocation + 4));
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_478);
    VVar16 = computeFinishBarrier.size;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_228);
    submitCommandsAndWait(vk_00,device_00,(VkQueue)VVar16,*ppVVar12);
    pBVar8 = de::SharedPtr<vkt::Draw::Buffer>::operator->(buffer);
    Draw::Buffer::getBoundMemory(&local_4a8,pBVar8);
    local_488 = &local_4a8;
    data = (deUint64)::vk::Allocation::getMemory(local_488);
    VVar16 = ::vk::Allocation::getOffset(local_488);
    ::vk::invalidateMappedMemoryRange(vk_00,device_00,(VkDeviceMemory)data,VVar16,bufferSizeBytes);
    local_4b8 = 0;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_290);
    local_4c0 = pHVar13->m_internal;
    VVar6 = (*vk_00->_vptr_DeviceInterface[0x20])(vk_00,device_00,local_4c0,0,1,8,&local_4b8,0,1);
    ::vk::checkResult(VVar6,
                      "vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                      ,0x18c);
    pvVar10 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::operator[](this->m_parameters,local_90);
    dVar7 = getComputeExecution(this,pvVar10);
    if (dVar7 == local_4b8) {
      pvStack_4f0 = ::vk::Allocation::getHostPtr(local_488);
      local_4f4 = 0;
      while( true ) {
        uVar3 = local_4f4;
        pvVar10 = std::
                  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                  ::operator[](this->m_parameters,local_90);
        dVar7 = getComputeExecution(this,pvVar10);
        if (dVar7 <= uVar3) break;
        if (*(uint *)((long)pvStack_4f0 + (ulong)local_4f4 * 4) != local_4f4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_518,"Compute shader didn\'t write data to the buffer",
                     &local_519);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::allocator<char>::~allocator(&local_519);
          bufferPtr._0_4_ = 1;
          goto LAB_00cb2ed7;
        }
        local_4f4 = local_4f4 + 1;
      }
      bufferPtr._0_4_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,"QueryPoolResults incorrect",
                 (allocator<char> *)((long)&bufferPtr + 7));
      tcu::TestStatus::fail(__return_storage_ptr__,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bufferPtr + 7));
      bufferPtr._0_4_ = 1;
    }
LAB_00cb2ed7:
    ::vk::Allocation::~Allocation(&local_4a8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_290);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_228);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_1c0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_d0);
    if ((int)bufferPtr != 0) {
      return __return_storage_ptr__;
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus ComputeInvocationsTestInstance::executeTest (const VkCommandPool&			cmdPool,
															 const VkPipelineLayout			pipelineLayout,
															 const VkDescriptorSet&			descriptorSet,
															 const de::SharedPtr<Buffer>	buffer,
															 const VkDeviceSize				bufferSizeBytes)
{
	const DeviceInterface&				vk						= m_context.getDeviceInterface();
	const VkDevice						device					= m_context.getDevice();
	const VkQueue						queue					= m_context.getUniversalQueue();
	const VkBufferMemoryBarrier			computeFinishBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	for(size_t parametersNdx = 0u; parametersNdx < m_parameters.size(); ++parametersNdx)
	{
		clearBuffer(vk, device, buffer, bufferSizeBytes);
		const Unique<VkShaderModule>			shaderModule				(createShaderModule(vk, device,
																			m_context.getBinaryCollection().get(m_parameters[parametersNdx].shaderName), (VkShaderModuleCreateFlags)0u));

		const VkPipelineShaderStageCreateInfo	pipelineShaderStageParams	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0u,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
			*shaderModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		};

		const VkComputePipelineCreateInfo		pipelineCreateInfo			=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,										// const void*						pNext;
			(VkPipelineCreateFlags)0u,						// VkPipelineCreateFlags			flags;
			pipelineShaderStageParams,						// VkPipelineShaderStageCreateInfo	stage;
			pipelineLayout,									// VkPipelineLayout					layout;
			DE_NULL,										// VkPipeline						basePipelineHandle;
			0,												// deInt32							basePipelineIndex;
		};
		const Unique<VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo));

		const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const Unique<VkQueryPool>		queryPool			(makeQueryPool(vk, device, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT));

		beginCommandBuffer(vk, *cmdBuffer);
			vk.cmdResetQueryPool(*cmdBuffer, *queryPool, 0u, 1u);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

			vk.cmdBeginQuery(*cmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
			vk.cmdDispatch(*cmdBuffer, m_parameters[parametersNdx].groupSize.x(), m_parameters[parametersNdx].groupSize.y(), m_parameters[parametersNdx].groupSize.z());
			vk.cmdEndQuery(*cmdBuffer, *queryPool, 0u);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT,
				(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeFinishBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);
		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Compute shader invocations: " << getComputeExecution(m_parameters[parametersNdx]) << tcu::TestLog::EndMessage;

		// Wait for completion
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Validate the results
		const Allocation& bufferAllocation = buffer->getBoundMemory();
		invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);

		{
			deUint64 data = 0u;
			VK_CHECK(vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT));
			if (getComputeExecution(m_parameters[parametersNdx]) != data)
				return tcu::TestStatus::fail("QueryPoolResults incorrect");
		}

		const deUint32* bufferPtr = static_cast<deUint32*>(bufferAllocation.getHostPtr());
		for (deUint32 ndx = 0u; ndx < getComputeExecution(m_parameters[parametersNdx]); ++ndx)
		{
			if (bufferPtr[ndx] != ndx)
				return tcu::TestStatus::fail("Compute shader didn't write data to the buffer");
		}
	}
	return tcu::TestStatus::pass("Pass");
}